

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
detail::reader::operator()(reader *this,optional_field<example::exercise_t,_0UL> *val)

{
  bool bVar1;
  undefined8 uVar2;
  reference_type __position;
  type local_3b;
  exercise_t local_39;
  undefined1 local_38 [7];
  exercise_t v;
  type *local_18;
  optional_field<example::exercise_t,_0UL> *val_local;
  reader *this_local;
  
  local_18 = (type *)val;
  val_local = (optional_field<example::exercise_t,_0UL> *)this;
  bVar1 = boost::optional<std::bitset<16UL>_>::operator!(&this->opts_);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x40);
    bad_message();
    __cxa_throw(uVar2,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  __position = boost::optional<std::bitset<16UL>_>::operator*(&this->opts_);
  std::bitset<16UL>::operator[]((bitset<16UL> *)local_38,(size_t)__position);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_38);
  std::bitset<16UL>::reference::~reference((reference *)local_38);
  if (bVar1) {
    operator()(this,&local_39);
    example::optional_field<example::exercise_t,_0UL>::optional_field
              ((optional_field<example::exercise_t,_0UL> *)&local_3b,local_39);
    *local_18 = local_3b;
  }
  return;
}

Assistant:

void operator()(example::optional_field<T, N> & val) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
            val = example::optional_field<T, N>(std::move(v));
        }
    }